

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.h
# Opt level: O2

day __thiscall date::year_month_day_last::day(year_month_day_last *this)

{
  bool bVar1;
  byte bVar2;
  
  bVar2 = (this->mdl_).m_.m_;
  if (bVar2 == 2) {
    bVar1 = year::is_leap(&this->y_);
    if (bVar1) {
      return (day)'\x1d';
    }
    bVar2 = (this->mdl_).m_.m_;
  }
  return (day)(&DAT_00131180)[bVar2 - 1];
}

Assistant:

CONSTCD11 inline month month_day_last::month() const NOEXCEPT {return m_;}